

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeWriter.cpp
# Opt level: O1

bool __thiscall
Js::WasmByteCodeWriter::TryWriteWasmLoopStart<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (WasmByteCodeWriter *this,OpCodeAsmJs op,uint loopId,RegSlot *curRegs)

{
  uint uVar1;
  bool bVar2;
  long lVar3;
  Data *this_00;
  undefined2 local_1c [4];
  OpLayoutT_WasmLoopStart<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  
  if ((DAT_015b5fbd == '\0') && (local_1c[0] = (undefined2)loopId, loopId < 0x10000)) {
    lVar3 = 1;
    do {
      uVar1 = curRegs[lVar3 + -1];
      local_1c[lVar3] = (short)uVar1;
      if (0xffff < uVar1) goto LAB_007f69a0;
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != 6);
    this_00 = &(this->super_ByteCodeWriter).m_byteCodeData;
    ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)1>(this_00,op,&this->super_ByteCodeWriter,false);
    ByteCodeWriter::Data::Write(this_00,local_1c,0xc);
    bVar2 = true;
  }
  else {
LAB_007f69a0:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool WasmByteCodeWriter::TryWriteWasmLoopStart(OpCodeAsmJs op, uint loopId, __in_ecount(WAsmJs::LIMIT) RegSlot* curRegs)
{
    OpLayoutT_WasmLoopStart<SizePolicy> layout;
    if (SizePolicy::Assign(layout.loopId, loopId))
    {
        for (WAsmJs::Types type = WAsmJs::Types(0); type != WAsmJs::LIMIT; type = WAsmJs::Types(type + 1))
        {
            if (!SizePolicy::Assign(layout.curRegs[type], curRegs[type]))
            {
                return false;
            }
        }

        m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
        return true;
    }
    return false;
}